

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::seedIdMap(TIntermediate *this,TIdMaps *idMaps,longlong *idShift)

{
  TIntermAggregate *pTVar1;
  TUserIdTraverser TStack_a8;
  TBuiltInIdTraverser local_68;
  
  TBuiltInIdTraverser::TBuiltInIdTraverser(&local_68,idMaps);
  (*this->treeRoot->_vptr_TIntermNode[2])(this->treeRoot,&local_68);
  *idShift = local_68.idShift & 0xffffffffffffff;
  TUserIdTraverser::TUserIdTraverser(&TStack_a8,idMaps);
  pTVar1 = findLinkerObjects(this);
  (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[2])
            (pTVar1,&TStack_a8);
  return;
}

Assistant:

void TIntermediate::seedIdMap(TIdMaps& idMaps, long long& idShift)
{
    // all built-ins everywhere need to align on IDs and contribute to the max ID
    TBuiltInIdTraverser builtInIdTraverser(idMaps);
    treeRoot->traverse(&builtInIdTraverser);
    idShift = builtInIdTraverser.getIdShift() & TSymbolTable::uniqueIdMask;

    // user variables in the linker object list need to align on ids
    TUserIdTraverser userIdTraverser(idMaps);
    findLinkerObjects()->traverse(&userIdTraverser);
}